

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<unsigned_short>
               (uint length,unsigned_short value1,unsigned_short value2,bool allowTrash)

{
  long lVar1;
  ulong uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> pSrc2;
  unsigned_short *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  unsigned_short *local_98;
  shared_ptr<unsigned_short> pv1;
  shared_ptr<unsigned_short> pv2;
  shared_ptr<unsigned_short> presult;
  
  uVar2 = (ulong)length;
  puVar3 = nosimd::common::malloc<unsigned_short>(length);
  std::__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2> *)&local_98,puVar3,
             nosimd::common::free<unsigned_short>);
  puVar3 = nosimd::common::malloc<unsigned_short>(length);
  std::__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar3,
             nosimd::common::free<unsigned_short>);
  puVar3 = nosimd::common::malloc<unsigned_short>(length + 1);
  std::__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((__shared_ptr<unsigned_short,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar3,
             nosimd::common::free<unsigned_short>);
  presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       pv1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(undefined2 *)
   ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar2 * 2) = 0x7f;
  nosimd::common::set<unsigned_short>(value1,local_98,length);
  pSrc2 = presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  nosimd::common::set<unsigned_short>
            (value2,(unsigned_short *)
                    presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    if ((local_98[uVar5] != value1) ||
       (lVar1 = uVar5 * 2, uVar5 = uVar5 + 1,
       *(unsigned_short *)((long)&(pSrc2._M_pi)->_vptr__Sp_counted_base + lVar1) != value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x1a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::add<unsigned_short>
            (local_98,(unsigned_short *)pSrc2._M_pi,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value1 + value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x22;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::sub<unsigned_short>
            (local_98,(unsigned_short *)pSrc2._M_pi,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value1 - value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x2a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mul<unsigned_short>
            (local_98,(unsigned_short *)pSrc2._M_pi,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value2 * value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x32;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_short>
            (local_98,(unsigned_short *)
                      presult.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + lVar1) != value1 / value2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x3a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::addC<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value1 + value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x43;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subC<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value1 - value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x4b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subCRev<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value2 - value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x53;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar1) !=
        (unsigned_short)(value2 * value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x5b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + lVar1) != value1 / value2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 99;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<unsigned_short>
            (local_98,value2,
             (unsigned_short *)
             pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar2 != uVar5) {
    lVar1 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(ushort *)
         ((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + lVar1) != value2 / value1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar4 + 1) = 0x6b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     (*(short *)((long)&(pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar2 * 2) != 0x7f)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
    *(undefined4 *)(puVar4 + 1) = 0x70;
    *(uint *)((long)puVar4 + 0xc) = length;
    __cxa_throw(puVar4,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}